

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O0

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::EnsureSource(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
               *this,MapRequestFor requestedFor,WCHAR *reasonString)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uchar **ppuVar6;
  undefined4 *puVar7;
  JsrtContext *this_00;
  ScriptContext *scriptContext_00;
  ThreadContext *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint local_e4;
  size_t cb;
  byte *script;
  bool isUtf8;
  bool isString;
  bool isExternalArray;
  undefined1 local_98 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  ScriptContext *scriptContext;
  size_t utf8AllocLength;
  size_t utf8Length;
  utf8char_t *utf8Source;
  size_t sourceLength;
  JavascriptString *pJStack_28;
  JsParseScriptAttributes attributes;
  JsValueRef scriptVal;
  WCHAR *reasonString_local;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *pJStack_10;
  MapRequestFor requestedFor_local;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *this_local;
  byte *script_;
  
  scriptVal = reasonString;
  reasonString_local._4_4_ = requestedFor;
  pJStack_10 = this;
  ppuVar6 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)&this->mappedSource);
  if (*ppuVar6 == (uchar *)0x0) {
    if (this->scriptLoadCallback == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xf0,"(scriptLoadCallback != nullptr)",
                                  "scriptLoadCallback != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppuVar6 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->mappedSource);
    if (*ppuVar6 != (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xf1,"(this->mappedSource == nullptr)",
                                  "this->mappedSource == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    sourceLength._4_4_ = 0;
    utf8Source = (utf8char_t *)0x0;
    utf8Length = 0;
    utf8AllocLength = 0;
    scriptContext = (ScriptContext *)0x0;
    this_00 = JsrtContext::GetCurrent();
    scriptContext_00 = JsrtContext::GetScriptContext(this_00);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext_00,&this_local);
    pTVar8 = ScriptContext::GetThreadContext(scriptContext_00);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_98,pTVar8);
    bVar2 = (*this->scriptLoadCallback)
                      (this->sourceContext,&stack0xffffffffffffffd8,
                       (_JsParseScriptAttributes *)((long)&sourceLength + 4));
    if (!bVar2) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
    }
    if (scriptContext_00 != (ScriptContext *)0x0) {
      pTVar8 = ScriptContext::GetThreadContext(scriptContext_00);
      ThreadContext::DisposeOnLeaveScript(pTVar8);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_98);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
    bVar2 = VarIs<Js::ArrayBuffer>(pJStack_28);
    uVar4 = sourceLength._4_4_ & 2;
    if ((!bVar2) && (bVar3 = VarIs<Js::JavascriptString>(pJStack_28), !bVar3)) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
    }
    if (bVar2) {
      iVar5 = (*(pJStack_28->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
      script_ = (byte *)CONCAT44(extraout_var,iVar5);
      local_e4 = (*(pJStack_28->super_RecyclableObject).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    }
    else {
      iVar5 = (*(pJStack_28->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      script_ = (byte *)CONCAT44(extraout_var_00,iVar5);
      local_e4 = JavascriptString::GetLength(pJStack_28);
    }
    JsrtSourceHolderPolicy<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*)>::
    ScriptToUtf8((ScriptContext *)0x0,script_,(bool)((uVar4 != 0 ^ 0xffU) & 1),(ulong)local_e4,
                 (utf8char_t **)&utf8Length,&utf8AllocLength,(size_t *)&utf8Source,
                 (size_t *)&scriptContext,true);
    Memory::WriteBarrierPtr<void>::operator=(&this->mappedScriptValue,pJStack_28);
    Memory::WriteBarrierPtr<const_unsigned_char>::operator=(&this->mappedSource,(uchar *)utf8Length)
    ;
    this->mappedSourceByteLength = utf8AllocLength;
    this->mappedAllocLength = (Type)scriptContext;
    this->scriptLoadCallback = (Type)0x0;
    if (scriptVal == (JsValueRef)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0x124,"(reasonString != nullptr)",
                                  "Reason string for why we are mapping the source was not provided."
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  return;
}

Assistant:

void JsrtSourceHolder<JsSerializedLoadScriptCallback,
        JsSerializedScriptUnloadCallback>::EnsureSource(MapRequestFor requestedFor,
        const WCHAR* reasonString)
    {
        if (this->mappedSource != nullptr)
        {
            return;
        }

        Assert(scriptLoadCallback != nullptr);
        Assert(this->mappedSource == nullptr);

        JsValueRef scriptVal;
        JsParseScriptAttributes attributes = JsParseScriptAttributeNone;
        size_t sourceLength = 0;
        utf8char_t *utf8Source = nullptr;
        size_t utf8Length = 0;
        size_t utf8AllocLength = 0;

        Js::ScriptContext* scriptContext = JsrtContext::GetCurrent()->GetScriptContext();
        BEGIN_LEAVE_SCRIPT(scriptContext)
        if (!scriptLoadCallback(sourceContext, &scriptVal, &attributes))
        {
            // Assume out of memory
            Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
        }
        END_LEAVE_SCRIPT(scriptContext);

        bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal),
             isString = false;
        bool isUtf8   = !(attributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

        if (!isExternalArray)
        {
            isString = Js::VarIs<Js::JavascriptString>(scriptVal);
            if (!isString)
            {
                Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
                return;
            }
        }

        const byte* script = isExternalArray ?
            ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer() :
            (const byte*)((Js::JavascriptString*)(scriptVal))->GetSz();
        const size_t cb = isExternalArray ?
            ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength() :
            ((Js::JavascriptString*)(scriptVal))->GetLength();

        JsrtSourceHolderPolicy<JsSerializedLoadScriptCallback>::ScriptToUtf8(nullptr,
            script, isUtf8, cb, &utf8Source, &utf8Length, &sourceLength,
            &utf8AllocLength, true);

        this->mappedScriptValue = scriptVal;
        this->mappedSource = utf8Source;
        this->mappedSourceByteLength = utf8Length;
        this->mappedAllocLength = utf8AllocLength;

        this->scriptLoadCallback = nullptr;

#if ENABLE_DEBUG_CONFIG_OPTIONS
        AssertMsg(reasonString != nullptr, "Reason string for why we are mapping the source was not provided.");
        JS_ETW(EventWriteJSCRIPT_SOURCEMAPPING(reasonString, (ushort)requestedFor));
#endif
    }